

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboColorbufferTests.cpp
# Opt level: O0

int __thiscall deqp::gles3::Functional::FboColorTests::init(FboColorTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 dVar1;
  deUint32 tex1Fmt;
  Context *pCVar2;
  TestNode *pTVar3;
  FboColorClearCase *this_00;
  char *pcVar4;
  FboColorMultiTex2DCase *this_01;
  TestNode *pTVar5;
  TextureFormat TVar6;
  FboBlendCase *this_02;
  TestNode *pTVar7;
  ulong extraout_RAX;
  ulong uVar8;
  uint local_14c;
  int fmtNdx_7;
  TestCaseGroup *rboGroup;
  int fmtNdx_6;
  TestCaseGroup *tex2DGroup_2;
  TestCaseGroup *blitGroup;
  int fmtNdx_5;
  TestCaseGroup *tex2DGroup_1;
  TestCaseGroup *sampleGroup;
  TestCaseGroup *repeatedClearGroup;
  Vector<int,_2> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined4 local_d8;
  allocator<char> local_d1;
  undefined1 local_d0 [8];
  string fmtName;
  TextureChannelClass fmtClass;
  TextureFormat texFmt;
  deUint32 format;
  int fmtNdx_4;
  TestCaseGroup *blendGroup;
  int local_84;
  TestNode *pTStack_80;
  int fmtNdx_3;
  TestCaseGroup *tex3DGroup;
  int local_6c;
  TestNode *pTStack_68;
  int fmtNdx_2;
  TestCaseGroup *tex2DArrayGroup;
  int local_54;
  TestNode *pTStack_50;
  int fmtNdx_1;
  TestCaseGroup *texCubeGroup;
  Vector<int,_2> local_3c;
  int local_34;
  TestNode *pTStack_30;
  int fmtNdx;
  TestCaseGroup *tex2DGroup;
  int ndx;
  TestNode *local_18;
  TestCaseGroup *clearGroup;
  FboColorTests *this_local;
  
  clearGroup = (TestCaseGroup *)this;
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"clear",
             "Color clears");
  local_18 = pTVar3;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  for (tex2DGroup._0_4_ = 0; pTVar3 = local_18, (int)tex2DGroup < 0x24;
      tex2DGroup._0_4_ = (int)tex2DGroup + 1) {
    this_00 = (FboColorClearCase *)operator_new(0x98);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    pcVar4 = FboTestUtil::getFormatName(init::colorFormats[(int)tex2DGroup]);
    FboColorClearCase::FboColorClearCase
              (this_00,pCVar2,pcVar4,"",init::colorFormats[(int)tex2DGroup],0x81,0x75);
    tcu::TestNode::addChild(pTVar3,(TestNode *)this_00);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"tex2d",
             "Texture 2D tests");
  pTStack_30 = pTVar3;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  for (local_34 = 0; pTVar3 = pTStack_30, local_34 < 0x24; local_34 = local_34 + 1) {
    this_01 = (FboColorMultiTex2DCase *)operator_new(0xa8);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    pcVar4 = FboTestUtil::getFormatName(init::colorFormats[local_34]);
    dVar1 = init::colorFormats[local_34];
    tcu::Vector<int,_2>::Vector(&local_3c,0x81,0x75);
    tex1Fmt = init::colorFormats[local_34];
    tcu::Vector<int,_2>::Vector((Vector<int,_2> *)((long)&texCubeGroup + 4),99,0x80);
    FboColorMultiTex2DCase::FboColorMultiTex2DCase
              (this_01,pCVar2,pcVar4,"",dVar1,&local_3c,tex1Fmt,(IVec2 *)((long)&texCubeGroup + 4));
    tcu::TestNode::addChild(pTVar3,(TestNode *)this_01);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"texcube",
             "Texture cube map tests");
  pTStack_50 = pTVar3;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  for (local_54 = 0; pTVar3 = pTStack_50, local_54 < 0x24; local_54 = local_54 + 1) {
    pTVar5 = (TestNode *)operator_new(0x98);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    pcVar4 = FboTestUtil::getFormatName(init::colorFormats[local_54]);
    dVar1 = init::colorFormats[local_54];
    tcu::Vector<int,_2>::Vector((Vector<int,_2> *)((long)&tex2DArrayGroup + 4),0x80,0x80);
    FboColorTexCubeCase::FboColorTexCubeCase
              ((FboColorTexCubeCase *)pTVar5,pCVar2,pcVar4,"",dVar1,
               (IVec2 *)((long)&tex2DArrayGroup + 4));
    tcu::TestNode::addChild(pTVar3,pTVar5);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"tex2darray",
             "Texture 2D array tests");
  pTStack_68 = pTVar3;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  for (local_6c = 0; pTVar3 = pTStack_68, local_6c < 0x24; local_6c = local_6c + 1) {
    pTVar5 = (TestNode *)operator_new(0x98);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    pcVar4 = FboTestUtil::getFormatName(init::colorFormats[local_6c]);
    dVar1 = init::colorFormats[local_6c];
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&tex3DGroup,0x80,0x80,5);
    FboColorTex2DArrayCase::FboColorTex2DArrayCase
              ((FboColorTex2DArrayCase *)pTVar5,pCVar2,pcVar4,"",dVar1,(IVec3 *)&tex3DGroup);
    tcu::TestNode::addChild(pTVar3,pTVar5);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"tex3d",
             "Texture 3D tests");
  pTStack_80 = pTVar3;
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  for (local_84 = 0; pTVar3 = pTStack_80, local_84 < 0x24; local_84 = local_84 + 1) {
    pTVar5 = (TestNode *)operator_new(0x98);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    pcVar4 = FboTestUtil::getFormatName(init::colorFormats[local_84]);
    dVar1 = init::colorFormats[local_84];
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&blendGroup,0x80,0x80,5);
    FboColorTex3DCase::FboColorTex3DCase
              ((FboColorTex3DCase *)pTVar5,pCVar2,pcVar4,"",dVar1,(IVec3 *)&blendGroup);
    tcu::TestNode::addChild(pTVar3,pTVar5);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"blend",
             "Blending tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  for (texFmt.type = SNORM_INT8; (int)texFmt.type < 0x24; texFmt.type = texFmt.type + SNORM_INT16) {
    dVar1 = init::colorFormats[(int)texFmt.type];
    TVar6 = glu::mapGLInternalFormat(dVar1);
    fmtClass = TVar6.type;
    fmtName.field_2._12_4_ = tcu::getTextureChannelClass(fmtClass);
    pcVar4 = FboTestUtil::getFormatName(dVar1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_d0,pcVar4,&local_d1);
    std::allocator<char>::~allocator(&local_d1);
    if (((fmtClass == 0x23) || (fmtName.field_2._12_4_ == 2)) || (fmtName.field_2._12_4_ == 3)) {
      local_d8 = 0x13;
    }
    else {
      this_02 = (FboBlendCase *)operator_new(0xb0);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      std::operator+(&local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     "_src_over");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      tcu::Vector<int,_2>::Vector(&local_100,0x7f,0x6f);
      FboBlendCase::FboBlendCase
                (this_02,pCVar2,pcVar4,"",dVar1,&local_100,0x8006,0x8006,0x302,0x303,0,1);
      tcu::TestNode::addChild(pTVar3,(TestNode *)this_02);
      std::__cxx11::string::~string((string *)&local_f8);
      local_d8 = 0;
    }
    std::__cxx11::string::~string((string *)local_d0);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "repeated_clear","Repeated clears and blits");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"sample",
             "Read by sampling");
  tcu::TestNode::addChild(pTVar3,pTVar5);
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"tex2d",
             "2D Texture");
  tcu::TestNode::addChild(pTVar5,pTVar7);
  for (blitGroup._4_4_ = 0; blitGroup._4_4_ < 0x24; blitGroup._4_4_ = blitGroup._4_4_ + 1) {
    pTVar5 = (TestNode *)operator_new(0x90);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    pcVar4 = FboTestUtil::getFormatName(init::colorFormats[blitGroup._4_4_]);
    FboRepeatedClearSampleTex2DCase::FboRepeatedClearSampleTex2DCase
              ((FboRepeatedClearSampleTex2DCase *)pTVar5,pCVar2,pcVar4,"",
               init::colorFormats[blitGroup._4_4_]);
    tcu::TestNode::addChild(pTVar7,pTVar5);
  }
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"blit",
             "Blitted");
  tcu::TestNode::addChild(pTVar3,pTVar5);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"tex2d",
             "2D Texture");
  tcu::TestNode::addChild(pTVar5,pTVar3);
  for (rboGroup._4_4_ = 0; rboGroup._4_4_ < 0x24; rboGroup._4_4_ = rboGroup._4_4_ + 1) {
    pTVar7 = (TestNode *)operator_new(0x90);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    pcVar4 = FboTestUtil::getFormatName(init::colorFormats[rboGroup._4_4_]);
    FboRepeatedClearBlitTex2DCase::FboRepeatedClearBlitTex2DCase
              ((FboRepeatedClearBlitTex2DCase *)pTVar7,pCVar2,pcVar4,"",
               init::colorFormats[rboGroup._4_4_]);
    tcu::TestNode::addChild(pTVar3,pTVar7);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"rbo",
             "Renderbuffer");
  tcu::TestNode::addChild(pTVar5,pTVar3);
  local_14c = 0;
  uVar8 = extraout_RAX;
  while ((int)local_14c < 0x24) {
    pTVar5 = (TestNode *)operator_new(0x90);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    pcVar4 = FboTestUtil::getFormatName(init::colorFormats[(int)local_14c]);
    FboRepeatedClearBlitRboCase::FboRepeatedClearBlitRboCase
              ((FboRepeatedClearBlitRboCase *)pTVar5,pCVar2,pcVar4,"",
               init::colorFormats[(int)local_14c]);
    tcu::TestNode::addChild(pTVar3,pTVar5);
    local_14c = local_14c + 1;
    uVar8 = (ulong)local_14c;
  }
  return (int)uVar8;
}

Assistant:

void FboColorTests::init (void)
{
	static const deUint32 colorFormats[] =
	{
		// RGBA formats
		GL_RGBA32I,
		GL_RGBA32UI,
		GL_RGBA16I,
		GL_RGBA16UI,
		GL_RGBA8,
		GL_RGBA8I,
		GL_RGBA8UI,
		GL_SRGB8_ALPHA8,
		GL_RGB10_A2,
		GL_RGB10_A2UI,
		GL_RGBA4,
		GL_RGB5_A1,

		// RGB formats
		GL_RGB8,
		GL_RGB565,

		// RG formats
		GL_RG32I,
		GL_RG32UI,
		GL_RG16I,
		GL_RG16UI,
		GL_RG8,
		GL_RG8I,
		GL_RG8UI,

		// R formats
		GL_R32I,
		GL_R32UI,
		GL_R16I,
		GL_R16UI,
		GL_R8,
		GL_R8I,
		GL_R8UI,

		// GL_EXT_color_buffer_float
		GL_RGBA32F,
		GL_RGBA16F,
		GL_R11F_G11F_B10F,
		GL_RG32F,
		GL_RG16F,
		GL_R32F,
		GL_R16F,

		// GL_EXT_color_buffer_half_float
		GL_RGB16F
	};

	// .clear
	{
		tcu::TestCaseGroup* clearGroup = new tcu::TestCaseGroup(m_testCtx, "clear", "Color clears");
		addChild(clearGroup);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(colorFormats); ndx++)
			clearGroup->addChild(new FboColorClearCase(m_context, getFormatName(colorFormats[ndx]), "", colorFormats[ndx], 129, 117));
	}

	// .tex2d
	{
		tcu::TestCaseGroup* tex2DGroup = new tcu::TestCaseGroup(m_testCtx, "tex2d", "Texture 2D tests");
		addChild(tex2DGroup);

		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); fmtNdx++)
			tex2DGroup->addChild(new FboColorMultiTex2DCase(m_context, getFormatName(colorFormats[fmtNdx]), "",
															colorFormats[fmtNdx], IVec2(129, 117),
															colorFormats[fmtNdx], IVec2(99, 128)));
	}

	// .texcube
	{
		tcu::TestCaseGroup* texCubeGroup = new tcu::TestCaseGroup(m_testCtx, "texcube", "Texture cube map tests");
		addChild(texCubeGroup);

		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); fmtNdx++)
			texCubeGroup->addChild(new FboColorTexCubeCase(m_context, getFormatName(colorFormats[fmtNdx]), "",
														   colorFormats[fmtNdx], IVec2(128, 128)));
	}

	// .tex2darray
	{
		tcu::TestCaseGroup* tex2DArrayGroup = new tcu::TestCaseGroup(m_testCtx, "tex2darray", "Texture 2D array tests");
		addChild(tex2DArrayGroup);

		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); fmtNdx++)
			tex2DArrayGroup->addChild(new FboColorTex2DArrayCase(m_context, getFormatName(colorFormats[fmtNdx]), "",
																 colorFormats[fmtNdx], IVec3(128, 128, 5)));
	}

	// .tex3d
	{
		tcu::TestCaseGroup* tex3DGroup = new tcu::TestCaseGroup(m_testCtx, "tex3d", "Texture 3D tests");
		addChild(tex3DGroup);

		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); fmtNdx++)
			tex3DGroup->addChild(new FboColorTex3DCase(m_context, getFormatName(colorFormats[fmtNdx]), "",
													   colorFormats[fmtNdx], IVec3(128, 128, 5)));
	}

	// .blend
	{
		tcu::TestCaseGroup* blendGroup = new tcu::TestCaseGroup(m_testCtx, "blend", "Blending tests");
		addChild(blendGroup);

		for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); fmtNdx++)
		{
			deUint32					format		= colorFormats[fmtNdx];
			tcu::TextureFormat			texFmt		= glu::mapGLInternalFormat(format);
			tcu::TextureChannelClass	fmtClass	= tcu::getTextureChannelClass(texFmt.type);
			string						fmtName		= getFormatName(format);

			if (texFmt.type	== tcu::TextureFormat::FLOAT				||
				fmtClass	== tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER	||
				fmtClass	== tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER)
				continue; // Blending is not supported.

			blendGroup->addChild(new FboBlendCase(m_context, (fmtName + "_src_over").c_str(), "", format, IVec2(127, 111), GL_FUNC_ADD, GL_FUNC_ADD, GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA, GL_ZERO, GL_ONE));
		}
	}

	// .repeated_clear
	{
		tcu::TestCaseGroup* const repeatedClearGroup = new tcu::TestCaseGroup(m_testCtx, "repeated_clear", "Repeated clears and blits");
		addChild(repeatedClearGroup);

		// .sample.tex2d
		{
			tcu::TestCaseGroup* const sampleGroup = new tcu::TestCaseGroup(m_testCtx, "sample", "Read by sampling");
			repeatedClearGroup->addChild(sampleGroup);

			tcu::TestCaseGroup* const tex2DGroup = new tcu::TestCaseGroup(m_testCtx, "tex2d", "2D Texture");
			sampleGroup->addChild(tex2DGroup);

			for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); fmtNdx++)
				tex2DGroup->addChild(new FboRepeatedClearSampleTex2DCase(m_context, getFormatName(colorFormats[fmtNdx]),
																		 "", colorFormats[fmtNdx]));
		}

		// .blit
		{
			tcu::TestCaseGroup* const blitGroup = new tcu::TestCaseGroup(m_testCtx, "blit", "Blitted");
			repeatedClearGroup->addChild(blitGroup);

			// .tex2d
			{
				tcu::TestCaseGroup* const tex2DGroup = new tcu::TestCaseGroup(m_testCtx, "tex2d", "2D Texture");
				blitGroup->addChild(tex2DGroup);

				for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); fmtNdx++)
					tex2DGroup->addChild(new FboRepeatedClearBlitTex2DCase(m_context, getFormatName(colorFormats[fmtNdx]),
																		   "", colorFormats[fmtNdx]));
			}

			// .rbo
			{
				tcu::TestCaseGroup* const rboGroup = new tcu::TestCaseGroup(m_testCtx, "rbo", "Renderbuffer");
				blitGroup->addChild(rboGroup);

				for (int fmtNdx = 0; fmtNdx < DE_LENGTH_OF_ARRAY(colorFormats); fmtNdx++)
					rboGroup->addChild(new FboRepeatedClearBlitRboCase(m_context, getFormatName(colorFormats[fmtNdx]),
																	   "", colorFormats[fmtNdx]));
			}
		}
	}
}